

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrubberband.cpp
# Opt level: O2

void __thiscall QRubberBand::paintEvent(QRubberBand *this,QPaintEvent *param_1)

{
  long lVar1;
  long in_FS_OFFSET;
  undefined1 *local_98;
  QWidget *pQStack_90;
  QStyle *local_88;
  QStyleOptionRubberBand option;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (QStyle *)&DAT_aaaaaaaaaaaaaaaa;
  local_98 = &DAT_aaaaaaaaaaaaaaaa;
  pQStack_90 = (QWidget *)&DAT_aaaaaaaaaaaaaaaa;
  QStylePainter::QStylePainter((QStylePainter *)&local_98,&this->super_QWidget);
  option._64_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.styleObject = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.palette.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption.rect._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  option.super_QStyleOption._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QStyleOptionRubberBand::QStyleOptionRubberBand(&option);
  (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,&option);
  QStylePainter::drawControl((QStylePainter *)&local_98,CE_RubberBand,&option.super_QStyleOption);
  QStyleOption::~QStyleOption(&option.super_QStyleOption);
  QPainter::~QPainter((QPainter *)&local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRubberBand::paintEvent(QPaintEvent *)
{
    QStylePainter painter(this);
    QStyleOptionRubberBand option;
    initStyleOption(&option);
    painter.drawControl(QStyle::CE_RubberBand, option);
}